

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int arg_cmd_dispatch(char *name,int argc,char **argv,arg_dstr_t res)

{
  int iVar1;
  arg_cmd_info_t *paVar2;
  
  paVar2 = arg_cmd_info(name);
  if (paVar2 == (arg_cmd_info_t *)0x0) {
    __assert_fail("cmd_info != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/minlux[P]dymon/libs/argtable3/argtable3.c"
                  ,0x12e0,"int arg_cmd_dispatch(const char *, int, char **, arg_dstr_t)");
  }
  if (paVar2->proc != (arg_cmdfn *)0x0) {
    iVar1 = (*paVar2->proc)(argc,argv,res);
    return iVar1;
  }
  __assert_fail("cmd_info->proc != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/minlux[P]dymon/libs/argtable3/argtable3.c"
                ,0x12e1,"int arg_cmd_dispatch(const char *, int, char **, arg_dstr_t)");
}

Assistant:

int arg_cmd_dispatch(const char* name, int argc, char* argv[], arg_dstr_t res) {
    arg_cmd_info_t* cmd_info = arg_cmd_info(name);

    assert(cmd_info != NULL);
    assert(cmd_info->proc != NULL);

    return cmd_info->proc(argc, argv, res);
}